

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<Fad<double>,_10>::Resize(TPZManVector<Fad<double>,_10> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  Fad<double> *pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Fad<double> *pFVar6;
  long in_RSI;
  TPZManVector<Fad<double>,_10> *in_RDI;
  ulong uVar7;
  int64_t i_1;
  Fad<double> *newstore;
  int64_t realsize;
  int64_t i;
  Fad<double> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  Fad<double> *this_01;
  Fad<double> *in_stack_ffffffffffffff30;
  double dVar8;
  Fad<double> *local_98;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<Fad<double>_>).fNElements) {
    if ((in_RDI->super_TPZVec<Fad<double>_>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        if ((in_RDI->super_TPZVec<Fad<double>_>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<Fad<double>_>).fNElements;
              local_18 = local_18 + 1) {
            Fad<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          }
          pFVar6 = (in_RDI->super_TPZVec<Fad<double>_>).fStore;
          if (pFVar6 != (Fad<double> *)0x0) {
            dVar8 = pFVar6[-1].defaultVal;
            for (pFVar2 = pFVar6 + (long)dVar8; pFVar6 != pFVar2; pFVar2 = pFVar2 + -1) {
              Fad<double>::~Fad(in_stack_ffffffffffffff20);
            }
            operator_delete__(&pFVar6[-1].defaultVal,(long)dVar8 * 0x20 + 8);
          }
          (in_RDI->super_TPZVec<Fad<double>_>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<double>_>).fNAlloc = 0;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x20),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pFVar6 = (Fad<double> *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_98 = pFVar6;
          do {
            Fad<double>::Fad(in_stack_ffffffffffffff30);
            local_98 = local_98 + 1;
          } while (local_98 != pFVar6 + uVar3);
        }
        for (local_40 = 0; local_40 < (in_RDI->super_TPZVec<Fad<double>_>).fNElements;
            local_40 = local_40 + 1) {
          Fad<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        if (((in_RDI->super_TPZVec<Fad<double>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar2 = (in_RDI->super_TPZVec<Fad<double>_>).fStore, pFVar2 != (Fad<double> *)0x0)) {
          dVar8 = pFVar2[-1].defaultVal;
          this_01 = pFVar2 + (long)dVar8;
          while (pFVar2 != this_01) {
            this_01 = this_01 + -1;
            Fad<double>::~Fad(this_01);
          }
          operator_delete__(&pFVar2[-1].defaultVal,(long)dVar8 * 0x20 + 8);
        }
        (in_RDI->super_TPZVec<Fad<double>_>).fStore = pFVar6;
        (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<double>_>).fNAlloc = uVar3;
      }
    }
    else {
      (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}